

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O2

bool __thiscall GGSock::FileServer::addFile(FileServer *this,FileData *data)

{
  int *piVar1;
  int iVar2;
  _Head_base<0UL,_GGSock::FileServer::Impl_*,_false> _Var3;
  bool bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  pthread_mutex_t *__mutex;
  reference rVar8;
  
  __mutex = (pthread_mutex_t *)
            &((this->m_impl)._M_t.
              super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
              .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->mutex;
  std::mutex::lock((mutex *)&__mutex->__data);
  if ((data->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      (data->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    bVar4 = Impl::exists((this->m_impl)._M_t.
                         super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                         .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl,
                         &data->info);
    if (!bVar4) {
      _Var3._M_head_impl =
           (this->m_impl)._M_t.
           super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
           .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
      iVar2 = (_Var3._M_head_impl)->currentFileUpdateId;
      if (iVar2 != (int)(((long)*(pointer *)((long)&(_Var3._M_head_impl)->files + 8) -
                         *(long *)&((_Var3._M_head_impl)->files).
                                   super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                         ) / 0x68)) {
        iVar5 = (data->info).nChunks;
        if (iVar5 == 0) {
          iVar5 = *(int32_t *)((long)&(_Var3._M_head_impl)->parameters + 0xc);
          (data->info).nChunks = iVar5;
        }
        lVar7 = (long)(data->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(data->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        iVar6 = (int)lVar7;
        if (iVar6 < iVar5) {
          (data->info).nChunks = iVar6;
        }
        (data->info).filesize = lVar7;
        rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (&(_Var3._M_head_impl)->fileUsed,(long)iVar2);
        *rVar8._M_p = *rVar8._M_p | rVar8._M_mask;
        _Var3._M_head_impl =
             (this->m_impl)._M_t.
             super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
             .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
        FileData::operator=((FileData *)
                            ((long)(_Var3._M_head_impl)->currentFileUpdateId * 0x68 +
                            *(long *)&((_Var3._M_head_impl)->files).
                                      super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                            ),data);
        _Var3._M_head_impl =
             (this->m_impl)._M_t.
             super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
             .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
        piVar1 = &(_Var3._M_head_impl)->currentFileUpdateId;
        *piVar1 = *piVar1 + 1;
        (_Var3._M_head_impl)->changedFileInfos = true;
        bVar4 = true;
        goto LAB_00110fbb;
      }
    }
  }
  bVar4 = false;
LAB_00110fbb:
  pthread_mutex_unlock(__mutex);
  return bVar4;
}

Assistant:

bool FileServer::addFile(FileData && data) {
    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);

        if (data.data.size() == 0) {
            return false;
        }

        if (m_impl->exists(data.info)) {
            return false;
        }

        // todo : handle max files reached
        if (m_impl->currentFileUpdateId == (int) m_impl->files.size()) {
            return false;
        }

        if (data.info.nChunks == 0) {
            data.info.nChunks = m_impl->parameters.nDefaultFileChunks;
        }

        if (data.info.nChunks > (int32_t) data.data.size()) {
            data.info.nChunks = (int32_t) data.data.size();
        }

        data.info.filesize = data.data.size();

        m_impl->fileUsed[m_impl->currentFileUpdateId] = true;
        m_impl->files[m_impl->currentFileUpdateId] = std::move(data);

        m_impl->currentFileUpdateId++;

        m_impl->changedFileInfos = true;
    }

    return true;
}